

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O0

int32_t pkg_installCommonMode(char *installDir,char *fileName)

{
  UBool UVar1;
  int32_t iVar2;
  UErrorCode local_22c;
  char local_228 [4];
  UErrorCode status;
  char cmd [512];
  int32_t result;
  char *fileName_local;
  char *installDir_local;
  
  cmd[0x1fc] = '\0';
  cmd[0x1fd] = '\0';
  cmd[0x1fe] = '\0';
  cmd[0x1ff] = '\0';
  memset(local_228,0,0x200);
  UVar1 = T_FileStream_file_exists(installDir);
  if (UVar1 == '\0') {
    local_22c = U_ZERO_ERROR;
    uprv_mkdir(installDir,&local_22c);
    UVar1 = U_FAILURE(local_22c);
    if (UVar1 != '\0') {
      fprintf(_stderr,"Error creating installation directory: %s\n",installDir);
      return -1;
    }
  }
  sprintf(local_228,"%s %s %s",pkgDataFlags[0x10],fileName,installDir);
  cmd._508_4_ = runCommand(local_228,'\0');
  if (cmd._508_4_ != 0) {
    fprintf(_stderr,"Failed to install data file with command: %s\n",local_228);
  }
  iVar2._0_1_ = cmd[0x1fc];
  iVar2._1_1_ = cmd[0x1fd];
  iVar2._2_1_ = cmd[0x1fe];
  iVar2._3_1_ = cmd[0x1ff];
  return iVar2;
}

Assistant:

static int32_t pkg_installCommonMode(const char *installDir, const char *fileName) {
    int32_t result = 0;
    char cmd[SMALL_BUFFER_MAX_SIZE] = "";

    if (!T_FileStream_file_exists(installDir)) {
        UErrorCode status = U_ZERO_ERROR;

        uprv_mkdir(installDir, &status);
        if (U_FAILURE(status)) {
            fprintf(stderr, "Error creating installation directory: %s\n", installDir);
            return -1;
        }
    }
#ifndef U_WINDOWS_WITH_MSVC
    sprintf(cmd, "%s %s %s", pkgDataFlags[INSTALL_CMD], fileName, installDir);
#else
    sprintf(cmd, "%s %s %s %s", WIN_INSTALL_CMD, fileName, installDir, WIN_INSTALL_CMD_FLAGS);
#endif

    result = runCommand(cmd);
    if (result != 0) {
        fprintf(stderr, "Failed to install data file with command: %s\n", cmd);
    }

    return result;
}